

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall
AddressFactory_CreateTaprootAddress_Test::TestBody(AddressFactory_CreateTaprootAddress_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertHelper local_3f0;
  ScriptBuilder build;
  SchnorrPubkey pubkey;
  TaprootScriptTree tree;
  AddressFactory factory;
  Address local_2f8;
  Address addr;
  
  cfd::AddressFactory::AddressFactory(&factory);
  cfd::core::Address::Address(&addr);
  std::__cxx11::string::string
            ((string *)&local_2f8,"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb"
             ,(allocator *)&tree);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&pubkey,(string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateTaprootAddress(&local_2f8,&factory,&pubkey);
      cfd::core::Address::operator=(&addr,&local_2f8);
      cfd::core::Address::~Address(&local_2f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x13e,
               "Expected: addr = factory.CreateTaprootAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2f8);
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_2f8,&addr);
  testing::internal::CmpHelperEQ<char[63],std::__cxx11::string>
            ((internal *)&tree,"\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             "addr.GetAddress()",
             (char (*) [63])"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  if ((char)tree.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&local_2f8);
    if (tree.super_TapBranch._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)tree.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&build,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&build,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&build);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree.super_TapBranch.has_leaf_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SchnorrPubkey::GetByteData256((ByteData256 *)&tree,&pubkey);
      cfd::AddressFactory::CreateTaprootAddress(&local_2f8,&factory,(ByteData256 *)&tree);
      cfd::core::Address::operator=(&addr,&local_2f8);
      cfd::core::Address::~Address(&local_2f8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tree);
    }
  }
  else {
    testing::Message::Message((Message *)&local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tree,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x141,
               "Expected: addr = factory.CreateTaprootAddress(pubkey.GetByteData256()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&tree,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tree);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2f8);
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_2f8,&addr);
  testing::internal::CmpHelperEQ<char[63],std::__cxx11::string>
            ((internal *)&tree,"\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             "addr.GetAddress()",
             (char (*) [63])"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  if ((char)tree.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&local_2f8);
    if (tree.super_TapBranch._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)tree.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&build,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&build,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&build);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree.super_TapBranch.has_leaf_);
  build._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ScriptBuilder::AppendOperator
            (&build,(ScriptOperator *)cfd::core::ScriptOperator::OP_TRUE);
  cfd::core::ScriptBuilder::Build((Script *)&local_2f8,&build);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,(Script *)&local_2f8);
  cfd::core::Script::~Script((Script *)&local_2f8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateTaprootAddress(&local_2f8,&factory,&tree,&pubkey);
      cfd::core::Address::operator=(&addr,&local_2f8);
      cfd::core::Address::~Address(&local_2f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x147,
               "Expected: addr = factory.CreateTaprootAddress(tree, pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2f8);
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_2f8,&addr);
  testing::internal::CmpHelperEQ<char[63],std::__cxx11::string>
            ((internal *)&gtest_ar_2,
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",
             "addr.GetAddress()",
             (char (*) [63])"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_2f8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  cfd::core::ScriptBuilder::~ScriptBuilder(&build);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  cfd::core::Address::~Address(&addr);
  cfd::AddressFactory::~AddressFactory(&factory);
  return;
}

Assistant:

TEST(AddressFactory, CreateTaprootAddress)
{
  AddressFactory factory;
  Address addr;
  const SchnorrPubkey pubkey = SchnorrPubkey(
    "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(pubkey));
  EXPECT_EQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4", addr.GetAddress());

  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(pubkey.GetByteData256()));
  EXPECT_EQ("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4", addr.GetAddress());

  ScriptBuilder build;
  build.AppendOperator(ScriptOperator::OP_TRUE);
  TaprootScriptTree tree(build.Build());
  EXPECT_NO_THROW(addr = factory.CreateTaprootAddress(tree, pubkey));
  EXPECT_EQ("bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah", addr.GetAddress());
}